

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

void __thiscall Fl_Tree_Item::hide_widgets(Fl_Tree_Item *this)

{
  long lVar1;
  
  if (this->_widget != (Fl_Widget *)0x0) {
    (*this->_widget->_vptr_Fl_Widget[6])();
  }
  if (0 < (this->_children)._total) {
    lVar1 = 0;
    do {
      hide_widgets((this->_children)._items[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (this->_children)._total);
  }
  return;
}

Assistant:

void Fl_Tree_Item::hide_widgets() {
  if ( _widget ) _widget->hide();
  for ( int t=0; t<_children.total(); t++ ) {
    _children[t]->hide_widgets();
  }
}